

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstHoisting.cpp
# Opt level: O0

void __thiscall wasm::ConstHoisting::~ConstHoisting(ConstHoisting *this)

{
  ConstHoisting *this_local;
  
  ~ConstHoisting(this);
  operator_delete(this,0x180);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }